

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

void __thiscall MIDIStreamer::MusicVolumeChanged(MIDIStreamer *this)

{
  DWORD DVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  
  uVar4 = 0xffff;
  if (this->MIDI != (MIDIDevice *)0x0) {
    iVar2 = (*this->MIDI->_vptr_MIDIDevice[0xe])();
    if ((char)iVar2 != '\0') {
      fVar5 = relative_volume * snd_musicvolume.Value;
      if (1.0 <= fVar5) {
        fVar5 = 1.0;
      }
      fVar6 = 0.0;
      if (0.0 <= fVar5) {
        fVar6 = fVar5;
      }
      uVar3 = (uint)(long)(fVar6 * 65535.0);
      uVar4 = 0xffff;
      if (uVar3 < 0xffff) {
        uVar4 = uVar3;
      }
    }
  }
  this->Volume = uVar4;
  if (((this->super_MusInfo).m_Status == STATE_Playing) && (this->MIDI != (MIDIDevice *)0x0)) {
    DVar1 = this->Volume;
    iVar2 = (*this->MIDI->_vptr_MIDIDevice[0xe])();
    if ((char)iVar2 != '\0') {
      this->NewVolume = DVar1;
      this->VolumeChanged = true;
    }
  }
  return;
}

Assistant:

void MIDIStreamer::MusicVolumeChanged()
{
	if (MIDI != NULL && MIDI->FakeVolume())
	{
		float realvolume = clamp<float>(snd_musicvolume * relative_volume, 0.f, 1.f);
		Volume = clamp<DWORD>((DWORD)(realvolume * 65535.f), 0, 65535);
	}
	else
	{
		Volume = 0xFFFF;
	}
	if (m_Status == STATE_Playing)
	{
		OutputVolume(Volume);
	}
}